

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_channel_converter_config *
ma_channel_converter_config_init
          (ma_channel_converter_config *__return_storage_ptr__,ma_format format,ma_uint32 channelsIn
          ,ma_channel *channelMapIn,ma_uint32 channelsOut,ma_channel *channelMapOut,
          ma_channel_mix_mode mixingMode)

{
  ma_channel_converter_config *config;
  ma_channel *channelMapOut_local;
  ma_uint32 channelsOut_local;
  ma_channel *channelMapIn_local;
  ma_uint32 channelsIn_local;
  ma_format format_local;
  
  memset(__return_storage_ptr__,0,0x1050);
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channelsIn = channelsIn;
  __return_storage_ptr__->channelsOut = channelsOut;
  ma_channel_map_copy(__return_storage_ptr__->channelMapIn,channelMapIn,channelsIn);
  ma_channel_map_copy(__return_storage_ptr__->channelMapOut,channelMapOut,channelsOut);
  __return_storage_ptr__->mixingMode = mixingMode;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_channel_converter_config ma_channel_converter_config_init(ma_format format, ma_uint32 channelsIn, const ma_channel channelMapIn[MA_MAX_CHANNELS], ma_uint32 channelsOut, const ma_channel channelMapOut[MA_MAX_CHANNELS], ma_channel_mix_mode mixingMode)
{
    ma_channel_converter_config config;
    MA_ZERO_OBJECT(&config);
    config.format      = format;
    config.channelsIn  = channelsIn;
    config.channelsOut = channelsOut;
    ma_channel_map_copy(config.channelMapIn,  channelMapIn,  channelsIn);
    ma_channel_map_copy(config.channelMapOut, channelMapOut, channelsOut);
    config.mixingMode  = mixingMode;

    return config;
}